

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O2

uint32_t GetNextKey(uint32_t key,int len)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = 1 << ((char)len - 1U & 0x1f);
  do {
    uVar2 = uVar1;
    uVar1 = uVar2 >> 1;
  } while ((uVar2 & key) != 0);
  return (uVar2 - 1 & key) + uVar2;
}

Assistant:

static WEBP_INLINE uint32_t GetNextKey(uint32_t key, int len) {
  uint32_t step = 1 << (len - 1);
  while (key & step) {
    step >>= 1;
  }
  return step ? (key & (step - 1)) + step : key;
}